

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O3

NormalBlockISEInputs *
tcu::astc::anon_unknown_0::generateDefaultISEInputs
          (NormalBlockISEInputs *__return_storage_ptr__,NormalBlockParams *blockParams)

{
  bool bVar1;
  byte bVar2;
  ushort uVar3;
  ISEMode IVar4;
  ISEParams IVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  long lVar20;
  
  (__return_storage_ptr__->weight).isGivenInBlockForm = false;
  auVar19 = _DAT_00170150;
  auVar18 = _DAT_00170140;
  iVar11 = blockParams->weightGridHeight * blockParams->weightGridWidth;
  bVar1 = blockParams->isDualPlane;
  bVar2 = bVar1 & 0x1f;
  uVar12 = iVar11 << bVar2;
  IVar4 = (blockParams->weightISEParams).mode;
  iVar6 = (blockParams->weightISEParams).numBits;
  if (IVar4 == ISEMODE_PLAIN_BIT) {
    uVar13 = ~(-1 << ((byte)iVar6 & 0x1f));
  }
  else {
    if (IVar4 == ISEMODE_QUINT) {
      iVar9 = 5;
    }
    else {
      uVar13 = 0xffffffff;
      if (IVar4 != ISEMODE_TRIT) goto LAB_00167655;
      iVar9 = 3;
    }
    uVar13 = (iVar9 << ((byte)iVar6 & 0x1f)) - 1;
  }
LAB_00167655:
  if (bVar1 == false) {
    if (0 < iVar11 << bVar2) {
      uVar14 = uVar12 - 1;
      uVar8 = uVar14 >> 1;
      lVar7 = (ulong)uVar12 - 1;
      auVar25._8_4_ = (int)lVar7;
      auVar25._0_8_ = lVar7;
      auVar25._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar25 = auVar25 ^ _DAT_00170150;
      do {
        auVar27 = auVar18 ^ auVar19;
        if ((bool)(~(auVar27._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar27._0_4_ ||
                    auVar25._4_4_ < auVar27._4_4_) & 1)) {
          *(int *)((long)&(__return_storage_ptr__->weight).value + lVar7) = (int)uVar8 / (int)uVar14
          ;
        }
        if ((auVar27._12_4_ != auVar25._12_4_ || auVar27._8_4_ <= auVar25._8_4_) &&
            auVar27._12_4_ <= auVar25._12_4_) {
          *(int *)((long)&(__return_storage_ptr__->weight).value + lVar7 + 4) =
               (int)(uVar13 + uVar8) / (int)uVar14;
        }
        lVar20 = auVar18._8_8_;
        auVar18._0_8_ = auVar18._0_8_ + 2;
        auVar18._8_8_ = lVar20 + 2;
        lVar7 = lVar7 + 8;
        uVar8 = uVar8 + uVar13 * 2;
      } while ((ulong)(uVar12 + 1 >> 1) << 3 != lVar7);
    }
  }
  else if (0 < iVar11 << bVar2) {
    uVar14 = uVar12 - 1;
    uVar8 = uVar14 >> 1;
    uVar15 = (ulong)uVar12 - 1;
    auVar27._8_4_ = (int)uVar15;
    auVar27._0_8_ = uVar15;
    auVar27._12_4_ = (int)(uVar15 >> 0x20);
    auVar21._0_8_ = uVar15 >> 1;
    auVar21._8_8_ = auVar27._8_8_ >> 1;
    iVar11 = uVar13 * 4;
    lVar7 = 0;
    auVar21 = auVar21 ^ _DAT_00170150;
    do {
      auVar24._8_4_ = (int)lVar7;
      auVar24._0_8_ = lVar7;
      auVar24._12_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar25 = (auVar24 | auVar18) ^ auVar19;
      if ((bool)(~(auVar25._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar25._0_4_ ||
                  auVar21._4_4_ < auVar25._4_4_) & 1)) {
        *(int *)((long)&(__return_storage_ptr__->weight).value + lVar7 * 8) =
             (int)uVar8 / (int)uVar14;
      }
      if ((auVar25._12_4_ != auVar21._12_4_ || auVar25._8_4_ <= auVar21._8_4_) &&
          auVar25._12_4_ <= auVar21._12_4_) {
        *(int *)((long)&(__return_storage_ptr__->weight).value + lVar7 * 8 + 8) =
             (int)(uVar13 * 2 + uVar8) / (int)uVar14;
      }
      lVar7 = lVar7 + 2;
      uVar8 = uVar8 + iVar11;
    } while ((uVar15 >> 2) * 2 + 2 != lVar7);
    if (uVar12 != 1) {
      uVar15 = (ulong)uVar12 - 2;
      auVar22._8_4_ = (int)uVar15;
      auVar22._0_8_ = uVar15;
      auVar22._12_4_ = (int)(uVar15 >> 0x20);
      auVar23._0_8_ = uVar15 >> 1;
      auVar23._8_8_ = auVar22._8_8_ >> 1;
      iVar10 = uVar13 * 3 + (uVar14 >> 1);
      iVar9 = (uVar14 >> 1) + uVar13;
      lVar7 = 0;
      auVar23 = auVar23 ^ auVar19;
      do {
        auVar26._8_4_ = (int)lVar7;
        auVar26._0_8_ = lVar7;
        auVar26._12_4_ = (int)((ulong)lVar7 >> 0x20);
        auVar25 = (auVar26 | auVar18) ^ auVar19;
        if ((bool)(~(auVar25._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar25._0_4_ ||
                    auVar23._4_4_ < auVar25._4_4_) & 1)) {
          *(uint *)((long)&(__return_storage_ptr__->weight).value + lVar7 * 8 + 4) =
               uVar13 - iVar9 / (int)uVar14;
        }
        if ((auVar25._12_4_ != auVar23._12_4_ || auVar25._8_4_ <= auVar23._8_4_) &&
            auVar25._12_4_ <= auVar23._12_4_) {
          *(uint *)((long)&(__return_storage_ptr__->weight).value + lVar7 * 8 + 0xc) =
               uVar13 - iVar10 / (int)uVar14;
        }
        lVar7 = lVar7 + 2;
        iVar10 = iVar10 + iVar11;
        iVar9 = iVar9 + iVar11;
      } while ((uVar15 >> 1 & 0x7ffffffffffffffe) + 2 != lVar7);
    }
  }
  (__return_storage_ptr__->endpoint).isGivenInBlockForm = false;
  uVar13 = blockParams->numPartitions;
  if (blockParams->isMultiPartSingleCemMode == false) {
    if ((int)uVar13 < 1) {
      uVar14 = 0;
    }
    else {
      uVar15 = 0;
      uVar14 = 0;
      do {
        uVar14 = uVar14 + (blockParams->colorEndpointModes[uVar15] >> 2) * 2 + 2;
        uVar15 = uVar15 + 1;
      } while (uVar13 != uVar15);
    }
  }
  else {
    uVar14 = ((blockParams->colorEndpointModes[0] >> 2) * 2 + 2) * uVar13;
  }
  if (IVar4 == ISEMODE_PLAIN_BIT) {
    iVar11 = iVar6 * uVar12;
  }
  else {
    if (IVar4 == ISEMODE_QUINT) {
      iVar11 = (int)(uVar12 * 7) / 3;
      bVar16 = uVar12 * -0x55555553 + 0x2aaaaaaa < 0x55555555;
    }
    else {
      iVar11 = -1;
      if (IVar4 != ISEMODE_TRIT) goto LAB_00167998;
      iVar11 = (int)(uVar12 * 8) / 5;
      bVar16 = uVar12 * 0x66666668 + 0x19999999 < 0x33333333;
    }
    iVar11 = ((iVar11 + 1) - (uint)bVar16) + iVar6 * uVar12;
  }
LAB_00167998:
  iVar6 = -0x1d;
  if (blockParams->isMultiPartSingleCemMode == false) {
    iVar6 = uVar13 * -3 + -0x19;
  }
  iVar9 = -0x11;
  if ((ulong)uVar13 != 1) {
    iVar9 = iVar6;
  }
  IVar5 = computeMaximumRangeISEParams(((iVar9 + (uint)(bVar1 ^ 1) * 2) - iVar11) + 0x7e,uVar14);
  auVar18 = _DAT_00170150;
  IVar4 = IVar5.mode;
  if (IVar4 == ISEMODE_PLAIN_BIT) {
    uVar12 = ~(-1 << ((byte)IVar5.numBits & 0x1f));
  }
  else {
    if (IVar4 == ISEMODE_QUINT) {
      iVar6 = 5;
    }
    else {
      uVar12 = 0xffffffff;
      if (IVar4 != ISEMODE_TRIT) goto LAB_00167a05;
      iVar6 = 3;
    }
    uVar12 = (iVar6 << ((byte)IVar5.numBits & 0x1f)) - 1;
  }
LAB_00167a05:
  if (0 < (int)uVar14) {
    uVar13 = uVar14 - 1;
    uVar8 = uVar13 >> 1;
    lVar7 = (ulong)uVar14 - 1;
    auVar17._8_4_ = (int)lVar7;
    auVar17._0_8_ = lVar7;
    auVar17._12_4_ = (int)((ulong)lVar7 >> 0x20);
    lVar7 = 0;
    auVar17 = auVar17 ^ _DAT_00170150;
    auVar19 = _DAT_00170140;
    do {
      auVar25 = auVar19 ^ auVar18;
      if ((bool)(~(auVar25._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar25._0_4_ ||
                  auVar17._4_4_ < auVar25._4_4_) & 1)) {
        *(int *)((long)&(__return_storage_ptr__->endpoint).value + lVar7) = (int)uVar8 / (int)uVar13
        ;
      }
      uVar3 = -(ushort)(auVar25._12_4_ == auVar17._12_4_ && auVar17._8_4_ < auVar25._8_4_ ||
                       auVar17._12_4_ < auVar25._12_4_) ^ 0xffff;
      IVar5._2_6_ = 0;
      IVar5.mode._0_2_ = uVar3;
      if ((uVar3 & 1) != 0) {
        uVar15 = (long)(int)(uVar12 + uVar8) / (long)(int)uVar13;
        IVar5 = (ISEParams)(uVar15 & 0xffffffff);
        *(int *)((long)&(__return_storage_ptr__->endpoint).value + lVar7 + 4) = (int)uVar15;
      }
      lVar20 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 2;
      auVar19._8_8_ = lVar20 + 2;
      lVar7 = lVar7 + 8;
      uVar8 = uVar8 + uVar12 * 2;
    } while ((ulong)(uVar14 + 1 >> 1) << 3 != lVar7);
  }
  return (NormalBlockISEInputs *)IVar5;
}

Assistant:

static NormalBlockISEInputs generateDefaultISEInputs (const NormalBlockParams& blockParams)
{
	NormalBlockISEInputs result;

	{
		result.weight.isGivenInBlockForm = false;

		const int numWeights		= computeNumWeights(blockParams);
		const int weightRangeMax	= computeISERangeMax(blockParams.weightISEParams);

		if (blockParams.isDualPlane)
		{
			for (int i = 0; i < numWeights; i += 2)
				result.weight.value.plain[i] = (i*weightRangeMax + (numWeights-1)/2) / (numWeights-1);

			for (int i = 1; i < numWeights; i += 2)
				result.weight.value.plain[i] = weightRangeMax - (i*weightRangeMax + (numWeights-1)/2) / (numWeights-1);
		}
		else
		{
			for (int i = 0; i < numWeights; i++)
				result.weight.value.plain[i] = (i*weightRangeMax + (numWeights-1)/2) / (numWeights-1);
		}
	}

	{
		result.endpoint.isGivenInBlockForm = false;

		const int			numColorEndpointValues		= computeNumColorEndpointValues(&blockParams.colorEndpointModes[0], blockParams.numPartitions, blockParams.isMultiPartSingleCemMode);
		const int			numBitsForColorEndpoints	= computeNumBitsForColorEndpoints(blockParams);
		const ISEParams&	colorEndpointISEParams		= computeMaximumRangeISEParams(numBitsForColorEndpoints, numColorEndpointValues);
		const int			colorEndpointRangeMax		= computeISERangeMax(colorEndpointISEParams);

		for (int i = 0; i < numColorEndpointValues; i++)
			result.endpoint.value.plain[i] = (i*colorEndpointRangeMax + (numColorEndpointValues-1)/2) / (numColorEndpointValues-1);
	}

	return result;
}